

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O3

long linux_if_drops(char *if_name)

{
  char cVar1;
  size_t sVar2;
  FILE *__stream;
  char *pcVar3;
  int iVar4;
  bool bVar5;
  char buffer [512];
  long local_240;
  char local_238 [520];
  
  sVar2 = strlen(if_name);
  __stream = fopen("/proc/net/dev","r");
  if (__stream == (FILE *)0x0) {
    return 0;
  }
  pcVar3 = fgets(local_238,0x200,__stream);
  if (pcVar3 != (char *)0x0) {
    iVar4 = 2;
    local_240 = 0;
    bVar5 = false;
    do {
      if ((bVar5) || (pcVar3 = strstr(local_238,"bytes"), pcVar3 == (char *)0x0)) {
        pcVar3 = strstr(local_238,if_name);
        if ((pcVar3 != (char *)0x0) &&
           (((pcVar3 == local_238 || (pcVar3[-1] == ' ')) && (pcVar3[(int)sVar2] == ':')))) {
          pcVar3 = pcVar3 + (long)(int)sVar2 + 1;
          goto LAB_0011b1dd;
        }
        pcVar3 = fgets(local_238,0x200,__stream);
      }
      else {
        pcVar3 = fgets(local_238,0x200,__stream);
        iVar4 = 3;
        bVar5 = true;
      }
    } while (pcVar3 != (char *)0x0);
    goto LAB_0011b225;
  }
  goto LAB_0011b21c;
LAB_0011b1dd:
  do {
    cVar1 = *pcVar3;
    if (cVar1 == '\0') break;
    do {
      pcVar3 = pcVar3 + 1;
      if (cVar1 != ' ') break;
      cVar1 = *pcVar3;
    } while (cVar1 != '\0');
    do {
      cVar1 = *pcVar3;
      if (cVar1 == '\0') break;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != ' ');
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  for (; *pcVar3 == ' '; pcVar3 = pcVar3 + 1) {
  }
  if (*pcVar3 != '\0') {
    local_240 = strtol(pcVar3,(char **)0x0,10);
    goto LAB_0011b225;
  }
LAB_0011b21c:
  local_240 = 0;
LAB_0011b225:
  fclose(__stream);
  return local_240;
}

Assistant:

static long int
linux_if_drops(const char * if_name)
{
	char buffer[512];
	char * bufptr;
	FILE * file;
	int field_to_convert = 3, if_name_sz = strlen(if_name);
	long int dropped_pkts = 0;

	file = fopen("/proc/net/dev", "r");
	if (!file)
		return 0;

	while (!dropped_pkts && fgets( buffer, sizeof(buffer), file ))
	{
		/* 	search for 'bytes' -- if its in there, then
			that means we need to grab the fourth field. otherwise
			grab the third field. */
		if (field_to_convert != 4 && strstr(buffer, "bytes"))
		{
			field_to_convert = 4;
			continue;
		}

		/* find iface and make sure it actually matches -- space before the name and : after it */
		if ((bufptr = strstr(buffer, if_name)) &&
			(bufptr == buffer || *(bufptr-1) == ' ') &&
			*(bufptr + if_name_sz) == ':')
		{
			bufptr = bufptr + if_name_sz + 1;

			/* grab the nth field from it */
			while( --field_to_convert && *bufptr != '\0')
			{
				while (*bufptr != '\0' && *(bufptr++) == ' ');
				while (*bufptr != '\0' && *(bufptr++) != ' ');
			}

			/* get rid of any final spaces */
			while (*bufptr != '\0' && *bufptr == ' ') bufptr++;

			if (*bufptr != '\0')
				dropped_pkts = strtol(bufptr, NULL, 10);

			break;
		}
	}

	fclose(file);
	return dropped_pkts;
}